

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

void __thiscall
TempTracker<ObjectTempVerify>::MarkTemp
          (TempTracker<ObjectTempVerify> *this,StackSym *sym,BackwardPass *backwardPass)

{
  SymID value;
  Instr *instr;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOLEAN BVar5;
  bool bVar6;
  undefined4 *puVar7;
  BVSparse<Memory::JitArenaAllocator> **ppBVar8;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  undefined1 local_d8 [8];
  JitArenaAllocator tempAllocator;
  
  if (sym->m_type != TyVar) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x133,"(sym->IsVar())","sym->IsVar()");
    if (!bVar3) goto LAB_00635f33;
    *puVar7 = 0;
  }
  instr = backwardPass->currentInstr;
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    ((BVSparse<Memory::JitArenaAllocator> *)this,(sym->super_Sym).m_id);
  bVar3 = ObjectTempVerify::IsTempTransfer(instr);
  pHVar1 = (this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies;
  if (bVar3) {
    if (pHVar1 == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)
    goto LAB_00635beb;
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                      (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                       (sym->super_Sym).m_id);
LAB_00635bc2:
    if (BVar5 == '\0') {
      bVar6 = true;
      goto LAB_00635c0b;
    }
    if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
      pHVar1 = (this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies;
      value = (sym->super_Sym).m_id;
      if (bVar3) {
        ppBVar8 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                            (pHVar1,value);
        if (ppBVar8 == (BVSparse<Memory::JitArenaAllocator> **)0x0) goto LAB_00635be7;
        this_00 = *ppBVar8;
      }
      else {
        this_00 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                  GetAndClear(pHVar1,value);
      }
    }
    else {
      if (!bVar3) {
        HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Clear
                  ((this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferDependencies,
                   (sym->super_Sym).m_id);
      }
LAB_00635be7:
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    bVar6 = false;
  }
  else {
    if (pHVar1 != (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
      BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                        (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                         (sym->super_Sym).m_id);
      goto LAB_00635bc2;
    }
LAB_00635beb:
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (&(this->super_ObjectTempVerify).super_TempTrackerBase.tempTransferredSyms,
                       (sym->super_Sym).m_id);
    bVar6 = BVar5 == '\0';
LAB_00635c0b:
    this_00 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  if (BVar4 == '\0') {
    if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
      bVar3 = ObjectTemp::IsTempProducing(instr);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        bVar3 = ObjectTempVerify::IsTempTransfer(instr);
        bVar3 = !bVar3;
      }
      if (bVar6 || bVar3 != false) {
        bVar3 = (bool)(bVar3 ^ 1);
        bVar6 = false;
      }
      else if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        bVar6 = true;
        bVar3 = true;
      }
      else {
        bVar3 = ObjectTempVerify::DoTrace(backwardPass);
        if ((bVar3) && (DAT_015bc46a == '\x01')) {
          Output::Print(L"%s: Loop mark temp check instr:\n",L"MarkTempObjectVerify");
          IR::Instr::DumpSimple(instr);
          Output::Print(L"Transfer dependencies: ");
          BVSparse<Memory::JitArenaAllocator>::Dump(this_00);
          Output::Print(L"Upward exposed Uses  : ");
          BVSparse<Memory::JitArenaAllocator>::Dump(backwardPass->currentBlock->upwardExposedUses);
          Output::Print(L"\n");
        }
        tempAllocator.bvFreeList = (BVSparseNode *)backwardPass->currentBlock->upwardExposedUses;
        bVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this_00,(BVSparse<Memory::JitArenaAllocator> *)tempAllocator.bvFreeList);
        bVar3 = true;
        if (bVar6) {
          bVar3 = ObjectTempVerify::DoTrace(backwardPass);
          if (bVar3) {
            Output::Print(L"%s: Not temp (s%-03d): ",L"MarkTempObjectVerify",
                          (ulong)(sym->super_Sym).m_id);
            IR::Instr::DumpSimple(instr);
            Output::Print(L"       Transferred exposed uses: ");
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )local_d8,L"temp",
                               (((this->super_ObjectTempVerify).super_TempTrackerBase.nonTempSyms.
                                alloc)->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,
                               JsUtil::ExternalApi::RecoverUnusedMemory);
            tempAllocator.super_ArenaAllocator.
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
                 (void *)0x0;
            this_01 = BVSparse<Memory::JitArenaAllocator>::AndNew
                                (this_00,(BVSparse<Memory::JitArenaAllocator> *)
                                         tempAllocator.bvFreeList,(JitArenaAllocator *)local_d8);
            BVSparse<Memory::JitArenaAllocator>::Dump(this_01);
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)local_d8);
          }
          bVar3 = ObjectTempVerify::DependencyCheck(instr,this_00,backwardPass);
        }
        bVar6 = !bVar6;
      }
    }
    else {
      bVar6 = ObjectTempVerify::IsTempTransfer(instr);
      if (bVar3 != bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,400,
                           "(isTransferOperation == T::IsTempTransfer(instr) || T::IsTempPropertyTransferLoad(instr, backwardPass) || T::IsTempIndirTransferLoad(instr, backwardPass))"
                           ,
                           "isTransferOperation == T::IsTempTransfer(instr) || T::IsTempPropertyTransferLoad(instr, backwardPass) || T::IsTempIndirTransferLoad(instr, backwardPass)"
                          );
        if (!bVar6) {
LAB_00635f33:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      bVar6 = false;
    }
  }
  else {
    bVar3 = ObjectTempVerify::DoTrace(backwardPass);
    if (bVar3) {
      if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
        bVar3 = ObjectTemp::IsTempProducing(instr);
        if ((bVar3) || (bVar3 = ObjectTempVerify::IsTempTransfer(instr), bVar3)) {
          Output::Print(L"%s: Not temp (s%-03d):",L"MarkTempObjectVerify",
                        (ulong)(sym->super_Sym).m_id);
          IR::Instr::DumpSimple(instr);
        }
        bVar6 = false;
        bVar3 = false;
      }
      else {
        bVar6 = false;
        bVar3 = false;
      }
    }
    else {
      bVar6 = false;
      bVar3 = false;
    }
  }
  ObjectTempVerify::SetDstIsTemp(&this->super_ObjectTempVerify,bVar3,bVar6,instr,backwardPass);
  return;
}

Assistant:

void
TempTracker<T>::MarkTemp(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    Assert(sym->IsVar());

    IR::Instr * instr = backwardPass->currentInstr;
    BOOLEAN nonTemp = this->nonTempSyms.TestAndClear(sym->m_id);
    BOOLEAN isTempTransferred;
    BVSparse<JitArenaAllocator> * bvTempTransferDependencies = nullptr;

    bool const isTransferOperation =
        T::IsTempTransfer(instr)
        || T::IsTempPropertyTransferLoad(instr, backwardPass)
        || T::IsTempIndirTransferLoad(instr, backwardPass);

    if (this->tempTransferDependencies != nullptr)
    {
        // Since we don't iterate "while (!changed)" in loops, we don't have complete accurate dataflow
        // for loop carried dependencies. So don't clear the dependency transfer info.  WOOB:1121525

        // Check if this dst is transferred (assigned) to another symbol
        if (isTransferOperation)
        {
            isTempTransferred = this->tempTransferredSyms.Test(sym->m_id);
        }
        else
        {
            isTempTransferred = this->tempTransferredSyms.TestAndClear(sym->m_id);
        }

        // We only need to look at the dependencies if we are in a loop because of the back edge
        // Also we don't need to if we are in pre pass
        if (isTempTransferred)
        {
            if (!backwardPass->IsPrePass())
            {
                if (isTransferOperation)
                {
                    // Transfer operation, load but not clear the information
                    BVSparse<JitArenaAllocator> **pBv = this->tempTransferDependencies->Get(sym->m_id);
                    if (pBv)
                    {
                        bvTempTransferDependencies = *pBv;
                    }
                }
                else
                {
                    // Non transfer operation, load and clear the information and the dst value is replaced
                    bvTempTransferDependencies = this->tempTransferDependencies->GetAndClear(sym->m_id);
                }
            }
            else if (!isTransferOperation)
            {
                // In pre pass, and not a transfer operation (just an assign).  We can clear the dependency info
                // and not look at it.
                this->tempTransferDependencies->Clear(sym->m_id);
            }
        }
    }
    else
    {
        isTempTransferred = this->tempTransferredSyms.TestAndClear(sym->m_id);
    }

    // Reset the dst is temp bit (we set it optimistically on the loop pre pass)
    bool dstIsTemp = false;
    bool dstIsTempTransferred = false;

    if (nonTemp)
    {
#if DBG_DUMP
        if (T::DoTrace(backwardPass)  && !backwardPass->IsPrePass() && T::CanMarkTemp(instr, backwardPass))
        {
            Output::Print(_u("%s: Not temp (s%-03d):"), T::GetTraceName(), sym->m_id);
            instr->DumpSimple();
        }
#endif
    }
    else if (backwardPass->IsPrePass())
    {
        // On pre pass, we don't have complete information about whether it is tempable or
        // not from the back edge.  If we already discovered that it is not a temp (above), then
        // we don't mark it, other wise, assume that it is okay to be tempable and have the
        // second pass set the bit correctly.  The only works on dependency chain that is in order
        // e.g.
        //      s1 = Add
        //      s2 = s1
        //      s3 = s2
        // The dependencies tracking to catch the case whether the dependency chain is out of order
        // e.g
        //      s1 = Add
        //      s3 = s2
        //      s2 = s3

        Assert(isTransferOperation == T::IsTempTransfer(instr)
            || T::IsTempPropertyTransferLoad(instr, backwardPass)
            || T::IsTempIndirTransferLoad(instr, backwardPass));
        if (isTransferOperation)
        {
            dstIsTemp = true;
        }
    }
    else if (T::CanMarkTemp(instr, backwardPass))
    {
        dstIsTemp = true;

        if (isTempTransferred)
        {
            // Track whether the dst is transferred or not, and allocate separate stack slot for them
            // so that another dst will not overrides the value
            dstIsTempTransferred = true;

            // The temp is aliased, need to trace if there is another use of the set of aliased
            // sym that is still live so that we won't mark them this symbol and destroy the value

            if (bvTempTransferDependencies != nullptr)
            {
                // Inside a loop we need to track if any of the reg that we transferred to is still live
                //      s1 = Add
                //         = s2
                //      s2 = s1
                // Since s2 is still live on the next iteration when we reassign s1, making s1 a temp
                // will cause the value of s2 to change before it's use.

                // The upwardExposedUses are the live regs, check if it intersect with the set
                // of dependency or not.

#if DBG_DUMP
                if (T::DoTrace(backwardPass) && Js::Configuration::Global.flags.Verbose)
                {
                     Output::Print(_u("%s: Loop mark temp check instr:\n"), T::GetTraceName());
                     instr->DumpSimple();
                     Output::Print(_u("Transfer dependencies: "));
                     bvTempTransferDependencies->Dump();
                     Output::Print(_u("Upward exposed Uses  : "));
                     backwardPass->currentBlock->upwardExposedUses->Dump();
                     Output::Print(_u("\n"));
                }
#endif

                BVSparse<JitArenaAllocator> * upwardExposedUses = backwardPass->currentBlock->upwardExposedUses;
                bool hasExposedDependencies = bvTempTransferDependencies->Test(upwardExposedUses)
                    || T::HasExposedFieldDependencies(bvTempTransferDependencies, backwardPass);
                if (hasExposedDependencies)
                {
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: Not temp (s%-03d): "), T::GetTraceName(), sym->m_id);
                        instr->DumpSimple();
                        Output::Print(_u("       Transferred exposed uses: "));
                        JitArenaAllocator tempAllocator(_u("temp"), this->GetAllocator()->GetPageAllocator(), Js::Throw::OutOfMemory);
                        bvTempTransferDependencies->AndNew(upwardExposedUses, &tempAllocator)->Dump();
                    }
#endif

                    dstIsTemp = false;
                    dstIsTempTransferred = false;
#if DBG
                    if (IsObjectTempVerify<T>())
                    {
                        dstIsTemp = ObjectTempVerify::DependencyCheck(instr, bvTempTransferDependencies, backwardPass);
                    }
#endif
                    // Only ObjectTmepVerify would do the do anything here. All other returns false
                }
            }
        }
    }

    T::SetDstIsTemp(dstIsTemp, dstIsTempTransferred, instr, backwardPass);
}